

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O1

void __thiscall draco::DirectBitEncoder::EncodeBit(DirectBitEncoder *this,bool bit)

{
  iterator __position;
  uint32_t uVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,bit) != 0) {
    this->local_bits_ = this->local_bits_ | 0x80000000U >> ((byte)this->num_local_bits_ & 0x1f);
  }
  uVar1 = this->num_local_bits_ + 1;
  this->num_local_bits_ = uVar1;
  if (uVar1 == 0x20) {
    __position._M_current =
         (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,
                 &this->local_bits_);
    }
    else {
      *__position._M_current = this->local_bits_;
      (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->local_bits_ = 0;
    this->num_local_bits_ = 0;
  }
  return;
}

Assistant:

void EncodeBit(bool bit) {
    if (bit) {
      local_bits_ |= 1 << (31 - num_local_bits_);
    }
    num_local_bits_++;
    if (num_local_bits_ == 32) {
      bits_.push_back(local_bits_);
      num_local_bits_ = 0;
      local_bits_ = 0;
    }
  }